

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

void Extra_BitMatrixTransposePP(Vec_Ptr_t *vSimsIn,int nWordsIn,Vec_Wrd_t *vSimsOut,int nWordsOut)

{
  word *pwVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int i;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  word *pM [64];
  word *local_238 [65];
  
  if (vSimsIn->nSize != nWordsOut * 0x40) {
    __assert_fail("Vec_PtrSize(vSimsIn) == 64 * nWordsOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                  ,0xa6f,"void Extra_BitMatrixTransposePP(Vec_Ptr_t *, int, Vec_Wrd_t *, int)");
  }
  if (vSimsOut->nSize == vSimsIn->nSize * nWordsIn) {
    uVar2 = 0;
    uVar6 = (ulong)(uint)nWordsIn;
    if (nWordsIn < 1) {
      uVar6 = 0;
    }
    uVar7 = 0;
    if (0 < nWordsOut) {
      uVar7 = (ulong)(uint)nWordsOut;
    }
    iVar4 = nWordsOut * 0x3f;
    do {
      if (uVar2 == uVar7) {
        return;
      }
      iVar5 = iVar4;
      for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
        uVar9 = (ulong)(uint)((int)uVar2 << 6) | 0x3f;
        i = iVar5;
        for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
          pwVar1 = Vec_WrdEntryP(vSimsOut,i);
          local_238[lVar3] = pwVar1;
          if (vSimsIn->nSize <= (int)uVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          *pwVar1 = *(word *)((long)vSimsIn->pArray[uVar9] + uVar8 * 8);
          uVar9 = uVar9 - 1;
          i = i - nWordsOut;
        }
        Extra_Transpose64p(local_238);
        iVar5 = iVar5 + nWordsOut * 0x40;
      }
      uVar2 = uVar2 + 1;
      iVar4 = iVar4 + 1;
    } while( true );
  }
  __assert_fail("Vec_WrdSize(vSimsOut) == 64 * nWordsOut * nWordsIn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                ,0xa70,"void Extra_BitMatrixTransposePP(Vec_Ptr_t *, int, Vec_Wrd_t *, int)");
}

Assistant:

void Extra_BitMatrixTransposePP( Vec_Ptr_t * vSimsIn, int nWordsIn, Vec_Wrd_t * vSimsOut, int nWordsOut )
{    
    word * pM[64];  int i, y, x;
    assert( Vec_PtrSize(vSimsIn)  == 64 * nWordsOut );
    assert( Vec_WrdSize(vSimsOut) == 64 * nWordsOut * nWordsIn  );
    for ( x = 0; x < nWordsOut; x++ )
    for ( y = 0; y < nWordsIn;  y++ )
    {
        for ( i = 0; i < 64; i++ )
        {
            pM[i]    = Vec_WrdEntryP( vSimsOut, (64*y+63-i)*nWordsOut + x );
            pM[i][0] = ((word *)Vec_PtrEntry( vSimsIn, 64*x+63-i ))[y];
        }
        Extra_Transpose64p( pM );
    }
}